

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O2

void __thiscall
libcellml::HistoryEpoch::HistoryEpoch
          (HistoryEpoch *this,ComponentConstPtr *component,string *sourceUrl,string *destinationUrl)

{
  ImportedEntityConstPtr IStack_48;
  string *local_38;
  
  (this->mDestinationModel).super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mDestinationModel).super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->mDestinationUrl,(string *)destinationUrl);
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component_const,void>
            ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&IStack_48,
             &component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_38 = &this->mDestinationUrl;
  owningModel((ParentedEntityConstPtr *)&this->mSourceModel);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&IStack_48.
              super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  NamedEntity::name_abi_cxx11_
            (&this->mName,
             (NamedEntity *)
             (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr);
  (this->mReferenceName)._M_dataplus._M_p = (pointer)&(this->mReferenceName).field_2;
  (this->mReferenceName)._M_string_length = 0;
  (this->mReferenceName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->mSourceUrl,(string *)sourceUrl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->mType,"component",(allocator<char> *)&IStack_48);
  std::__shared_ptr<libcellml::ImportedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component_const,void>
            ((__shared_ptr<libcellml::ImportedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&IStack_48,
             &component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
  ;
  setReferenceName(this,&IStack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&IStack_48.
              super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr<libcellml::ImportedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component_const,void>
            ((__shared_ptr<libcellml::ImportedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&IStack_48,
             &component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
  ;
  setDestinationModel(this,&IStack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&IStack_48.
              super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

HistoryEpoch::HistoryEpoch(const ComponentConstPtr &component, const std::string &sourceUrl, const std::string &destinationUrl)
    : mDestinationModel(nullptr)
    , mDestinationUrl(destinationUrl)
    , mSourceModel(owningModel(component))
    , mName(component->name())
    , mSourceUrl(sourceUrl)
    , mType("component")
{
    setReferenceName(component);
    setDestinationModel(component);
}